

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O0

void pack_setup(void)

{
  t_symbol *s;
  
  s = gensym("pack");
  pack_class = class_new(s,pack_new,pack_free,0x58,0,A_GIMME,0);
  class_addbang(pack_class,pack_bang);
  class_addpointer(pack_class,pack_pointer);
  class_doaddfloat(pack_class,pack_float);
  class_addsymbol(pack_class,pack_symbol);
  class_addlist(pack_class,pack_list);
  class_addanything(pack_class,pack_anything);
  return;
}

Assistant:

static void pack_setup(void)
{
    pack_class = class_new(gensym("pack"), (t_newmethod)pack_new,
        (t_method)pack_free, sizeof(t_pack), 0, A_GIMME, 0);
    class_addbang(pack_class, pack_bang);
    class_addpointer(pack_class, pack_pointer);
    class_addfloat(pack_class, pack_float);
    class_addsymbol(pack_class, pack_symbol);
    class_addlist(pack_class, pack_list);
    class_addanything(pack_class, pack_anything);
}